

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<double,__1,__1> * __thiscall
Matrix<double,_-1,_-1>::operator=(Matrix<double,__1,__1> *this,Matrix<double,__1,__1> matrix)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  Matrix<double,__1,__1> local_40;
  double local_30;
  
  local_40.data = matrix.data;
  uVar3 = matrix._0_8_;
  if (&local_40 != this) {
    local_40._0_8_ = uVar3;
    if (this->data == (double *)0x0) {
      uVar5 = uVar3 >> 0x20;
    }
    else {
      operator_delete__(this->data);
      uVar3 = local_40._0_8_ & 0xffffffff;
      uVar5 = (ulong)local_40._0_8_ >> 0x20;
    }
    this->cols = (int)uVar5;
    iVar6 = (int)uVar3;
    this->rows = iVar6;
    iVar1 = iVar6 * (int)uVar5;
    uVar4 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar4 = (long)iVar1 * 8;
    }
    pdVar2 = (double *)operator_new__(uVar4);
    this->data = pdVar2;
    if (0 < iVar6) {
      iVar1 = 0;
      do {
        if (0 < (int)uVar5) {
          iVar6 = 0;
          do {
            pdVar2 = operator()(&local_40,iVar1,iVar6);
            local_30 = *pdVar2;
            pdVar2 = operator()(this,iVar1,iVar6);
            *pdVar2 = local_30;
            iVar6 = iVar6 + 1;
            uVar5 = (ulong)(uint)local_40.cols;
          } while (iVar6 < local_40.cols);
          uVar3 = local_40._0_8_ & 0xffffffff;
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 < (int)uVar3);
    }
  }
  return this;
}

Assistant:

const Matrix<Type, _0, _1> & Matrix<Type, _0, _1>::operator= (const Matrix<Type, _0, _1> matrix)
{
    if(this == &matrix)
    {
        return *this;
    }
    if(this->data != NULL)
    {
        delete [] data;
    }

    this->cols = matrix.col();
    this->rows = matrix.row();
    this->data = new Type[matrix.col() * matrix.row()];
    for(int i = 0; i < matrix.row(); ++i)
       for(int j = 0; j < matrix.col(); ++j)
       {
            double tmp = matrix(i, j);
            this->operator()(i, j) = tmp;
       }
    
    return (*this);
}